

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn64.c
# Opt level: O1

uc_err reg_write_sparc64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  if (regid - 0x35 < 8) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x35) * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x4e < 8) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)(*(long *)((long)_env + 0x40) + -0x270 + (ulong)regid * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x46 < 8) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)(*(long *)((long)_env + 0x40) + -0x1f0 + (ulong)regid * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x3d < 8) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)(*(long *)((long)_env + 0x40) + -0x168 + (ulong)regid * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else {
    if (regid != 0x58) {
      return UC_ERR_ARG;
    }
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + 0x48) = *value;
      *(long *)((long)_env + 0x50) = *value + 4;
      *setpc = 1;
      return UC_ERR_OK;
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                        size_t *size, int *setpc)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint64_t);
        env->gregs[regid - UC_SPARC_REG_G0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[regid - UC_SPARC_REG_O0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[8 + regid - UC_SPARC_REG_L0] = *(uint64_t *)value;
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        CHECK_REG_TYPE(uint64_t);
        env->regwptr[16 + regid - UC_SPARC_REG_I0] = *(uint64_t *)value;
    } else {
        switch(regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            env->pc = *(uint64_t *)value;
            env->npc = *(uint64_t *)value + 4;
            *setpc = 1;
            break;
        }
    }

    return ret;
}